

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obmc_variance_avx2.c
# Opt level: O1

uint aom_obmc_variance16x64_avx2(uint8_t *pre,int pre_stride,int32_t *wsrc,int32_t *mask,uint *sse)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  uint uVar3;
  long lVar4;
  undefined1 auVar5 [64];
  undefined1 auVar6 [32];
  undefined1 auVar7 [64];
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  
  auVar5 = ZEXT1664((undefined1  [16])0x0);
  uVar3 = 0x41;
  lVar4 = 0;
  auVar6._8_4_ = 0x800;
  auVar6._0_8_ = 0x80000000800;
  auVar6._12_4_ = 0x800;
  auVar6._16_4_ = 0x800;
  auVar6._20_4_ = 0x800;
  auVar6._24_4_ = 0x800;
  auVar6._28_4_ = 0x800;
  auVar7 = ZEXT1664((undefined1  [16])0x0);
  do {
    lVar4 = (long)(int)lVar4;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = *(ulong *)pre;
    auVar2 = vpmovzxbd_avx2(auVar1);
    auVar2 = vpmaddwd_avx2(auVar2,*(undefined1 (*) [32])(mask + lVar4));
    auVar2 = vpsubd_avx2(*(undefined1 (*) [32])(wsrc + lVar4),auVar2);
    auVar9 = vpsrad_avx2(auVar2,0x1f);
    auVar2 = vpaddd_avx2(auVar2,auVar6);
    auVar2 = vpaddd_avx2(auVar2,auVar9);
    auVar9 = vpsrad_avx2(auVar2,0xc);
    auVar8._8_8_ = *(ulong *)((long)pre + 8);
    auVar8._0_8_ = *(ulong *)((long)pre + 8);
    auVar2 = vpmovzxbd_avx2(auVar8);
    auVar2 = vpmaddwd_avx2(auVar2,*(undefined1 (*) [32])(mask + lVar4 + 8));
    auVar2 = vpsubd_avx2(*(undefined1 (*) [32])(wsrc + lVar4 + 8),auVar2);
    auVar10 = vpsrad_avx2(auVar2,0x1f);
    auVar2 = vpaddd_avx2(auVar2,auVar6);
    auVar2 = vpaddd_avx2(auVar2,auVar10);
    auVar10 = vpsrad_avx2(auVar2,0xc);
    auVar2 = vpackssdw_avx2(auVar9,auVar10);
    auVar2 = vpmaddwd_avx2(auVar2,auVar2);
    auVar2 = vpaddd_avx2(auVar2,auVar5._0_32_);
    auVar5 = ZEXT3264(auVar2);
    auVar9 = vpaddd_avx2(auVar9,auVar7._0_32_);
    auVar9 = vpaddd_avx2(auVar9,auVar10);
    auVar7 = ZEXT3264(auVar9);
    lVar4 = lVar4 + 0x10;
    pre = (uint8_t *)((long)pre + (long)pre_stride);
    uVar3 = uVar3 - 1;
  } while (1 < uVar3);
  auVar6 = vphaddd_avx2(auVar9,auVar2);
  auVar6 = vphaddd_avx2(auVar6,auVar6);
  auVar1 = vpaddd_avx(auVar6._16_16_,auVar6._0_16_);
  *sse = auVar1._4_4_;
  return auVar1._4_4_ - (int)((ulong)((long)auVar1._0_4_ * (long)auVar1._0_4_) >> 10);
}

Assistant:

static inline void obmc_variance_w16n(const uint8_t *pre, const int pre_stride,
                                      const int32_t *wsrc, const int32_t *mask,
                                      unsigned int *const sse, int *const sum,
                                      const int w, const int h) {
  int n = 0, width, height = h;
  __m256i v_d;
  __m128i res0;
  const uint8_t *pre_temp;
  const __m256i v_bias_d = _mm256_set1_epi32((1 << 12) >> 1);
  __m256i v_sum_d = _mm256_setzero_si256();
  __m256i v_sse_d = _mm256_setzero_si256();

  assert(w >= 16);
  assert(IS_POWER_OF_TWO(w));
  assert(IS_POWER_OF_TWO(h));
  do {
    width = w;
    pre_temp = pre;
    do {
      const __m128i v_p_b = _mm_loadu_si128((__m128i *)pre_temp);
      const __m256i v_m0_d = _mm256_loadu_si256((__m256i const *)(mask + n));
      const __m256i v_w0_d = _mm256_loadu_si256((__m256i const *)(wsrc + n));
      const __m256i v_m1_d =
          _mm256_loadu_si256((__m256i const *)(mask + n + 8));
      const __m256i v_w1_d =
          _mm256_loadu_si256((__m256i const *)(wsrc + n + 8));

      const __m256i v_p0_d = _mm256_cvtepu8_epi32(v_p_b);
      const __m256i v_p1_d = _mm256_cvtepu8_epi32(_mm_srli_si128(v_p_b, 8));

      const __m256i v_pm0_d = _mm256_madd_epi16(v_p0_d, v_m0_d);
      const __m256i v_pm1_d = _mm256_madd_epi16(v_p1_d, v_m1_d);

      const __m256i v_diff0_d = _mm256_sub_epi32(v_w0_d, v_pm0_d);
      const __m256i v_diff1_d = _mm256_sub_epi32(v_w1_d, v_pm1_d);

      const __m256i v_sign0_d = _mm256_srai_epi32(v_diff0_d, 31);
      const __m256i v_sign1_d = _mm256_srai_epi32(v_diff1_d, 31);

      const __m256i v_tmp0_d =
          _mm256_add_epi32(_mm256_add_epi32(v_diff0_d, v_bias_d), v_sign0_d);
      const __m256i v_tmp1_d =
          _mm256_add_epi32(_mm256_add_epi32(v_diff1_d, v_bias_d), v_sign1_d);

      const __m256i v_rdiff0_d = _mm256_srai_epi32(v_tmp0_d, 12);
      const __m256i v_rdiff2_d = _mm256_srai_epi32(v_tmp1_d, 12);

      const __m256i v_rdiff1_d = _mm256_add_epi32(v_rdiff0_d, v_rdiff2_d);
      const __m256i v_rdiff01_w = _mm256_packs_epi32(v_rdiff0_d, v_rdiff2_d);
      const __m256i v_sqrdiff_d = _mm256_madd_epi16(v_rdiff01_w, v_rdiff01_w);

      v_sum_d = _mm256_add_epi32(v_sum_d, v_rdiff1_d);
      v_sse_d = _mm256_add_epi32(v_sse_d, v_sqrdiff_d);

      pre_temp += 16;
      n += 16;
      width -= 16;
    } while (width > 0);
    pre += pre_stride;
    height -= 1;
  } while (height > 0);

  v_d = _mm256_hadd_epi32(v_sum_d, v_sse_d);
  v_d = _mm256_hadd_epi32(v_d, v_d);
  res0 = _mm256_castsi256_si128(v_d);
  res0 = _mm_add_epi32(res0, _mm256_extractf128_si256(v_d, 1));
  *sum = _mm_cvtsi128_si32(res0);
  *sse = (unsigned int)_mm_cvtsi128_si32(_mm_srli_si128(res0, 4));
}